

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

string * __thiscall
t_php_generator::type_to_cast_abi_cxx11_
          (string *__return_storage_ptr__,t_php_generator *this,t_type *type)

{
  uint uVar1;
  t_base tVar2;
  allocator local_42;
  allocator local_41;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d [20];
  allocator local_29;
  t_base_type *local_28;
  t_base_type *btype;
  t_type *type_local;
  t_php_generator *this_local;
  
  btype = (t_base_type *)type;
  type_local = (t_type *)this;
  this_local = (t_php_generator *)__return_storage_ptr__;
  uVar1 = (*(type->super_t_doc)._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(btype->super_t_type).super_t_doc._vptr_t_doc[10])();
    if ((uVar1 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_42);
      std::allocator<char>::~allocator((allocator<char> *)&local_42);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"(int)",&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
  }
  else {
    local_28 = btype;
    tVar2 = t_base_type::get_base(btype);
    switch(tVar2) {
    case TYPE_STRING:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"(string)",&local_3f);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f);
      break;
    case TYPE_BOOL:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"(bool)",&local_29);
      std::allocator<char>::~allocator((allocator<char> *)&local_29);
      break;
    case TYPE_I8:
    case TYPE_I16:
    case TYPE_I32:
    case TYPE_I64:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"(int)",local_3d);
      std::allocator<char>::~allocator((allocator<char> *)local_3d);
      break;
    case TYPE_DOUBLE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"(double)",&local_3e);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_php_generator::type_to_cast(t_type* type) {
  if (type->is_base_type()) {
    t_base_type* btype = (t_base_type*)type;
    switch (btype->get_base()) {
    case t_base_type::TYPE_BOOL:
      return "(bool)";
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      return "(int)";
    case t_base_type::TYPE_DOUBLE:
      return "(double)";
    case t_base_type::TYPE_STRING:
      return "(string)";
    default:
      return "";
    }
  } else if (type->is_enum()) {
    return "(int)";
  }
  return "";
}